

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecTree.c
# Opt level: O0

void Acec_TreeFindTrees2_rec
               (Vec_Int_t *vAdds,Vec_Int_t *vMap,int iAdd,int Rank,Vec_Int_t *vTree,
               Vec_Bit_t *vFound)

{
  int iVar1;
  int local_4c;
  int local_34;
  int k;
  Vec_Bit_t *vFound_local;
  Vec_Int_t *vTree_local;
  int Rank_local;
  int iAdd_local;
  Vec_Int_t *vMap_local;
  Vec_Int_t *vAdds_local;
  
  iVar1 = Vec_BitEntry(vFound,iAdd);
  if (iVar1 == 0) {
    Vec_BitWriteEntry(vFound,iAdd,1);
    Vec_IntPush(vTree,iAdd);
    Vec_IntPush(vTree,Rank);
    for (local_34 = 0; local_34 < 5; local_34 = local_34 + 1) {
      iVar1 = Vec_IntEntry(vAdds,iAdd * 6 + local_34);
      local_4c = Rank;
      if (local_34 == 4) {
        local_4c = Rank + 1;
      }
      Acec_TreeFindTrees_rec(vAdds,vMap,iVar1,local_4c,vTree,vFound);
    }
  }
  return;
}

Assistant:

void Acec_TreeFindTrees2_rec( Vec_Int_t * vAdds, Vec_Int_t * vMap, int iAdd, int Rank, Vec_Int_t * vTree, Vec_Bit_t * vFound )
{
    extern void Acec_TreeFindTrees_rec( Vec_Int_t * vAdds, Vec_Int_t * vMap, int iObj, int Rank, Vec_Int_t * vTree, Vec_Bit_t * vFound );
    int k;
    if ( Vec_BitEntry(vFound, iAdd) )
        return;
    Vec_BitWriteEntry( vFound, iAdd, 1 );
    Vec_IntPush( vTree, iAdd );
    Vec_IntPush( vTree, Rank );
    //printf( "Assigning rank %d to (%d:%d).\n", Rank, Vec_IntEntry(vAdds, 6*iAdd+3), Vec_IntEntry(vAdds, 6*iAdd+4) );
    for ( k = 0; k < 5; k++ )
        Acec_TreeFindTrees_rec( vAdds, vMap, Vec_IntEntry(vAdds, 6*iAdd+k), k == 4 ? Rank + 1 : Rank, vTree, vFound );
}